

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int main(int argc,char **argv)

{
  cargo_test_t *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined *puVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  FILE *__stream;
  char *__format;
  uint uVar11;
  long lVar12;
  long lVar13;
  cargo_t cargo;
  int all;
  int quiet;
  int local_300;
  int shortlist;
  long local_2f8;
  size_t test_name_count;
  char **test_names;
  ulong local_2e0;
  int tests_to_run [169];
  
  all = 0;
  quiet = 0;
  shortlist = 0;
  test_names = (char **)0x0;
  test_name_count = 0;
  memset(tests_to_run,0,0x2a4);
  cargo_suppress_debug = 1;
  iVar2 = cargo_init(&cargo,CARGO_NOERR_OUTPUT|CARGO_AUTOCLEAN,*argv);
  if (iVar2 == 0) {
    cargo_set_description
              (cargo,"You can add additional debug output by compiling with CARGO_DEBUG=<level>");
    iVar2 = cargo_add_option(cargo,0,"--shortlist --short -s",
                             "Only show the tests that have been run, don\'t include the entire list."
                             ,"b",&shortlist);
    iVar3 = cargo_add_option(cargo,0,"--all -a","Run all tests.","b",&all);
    iVar4 = cargo_add_option(cargo,0,"--quiet -q","Suppress CARGO_DEBUG output.","b",&quiet);
    iVar5 = cargo_add_option(cargo,0,"tests",
                             "Either a test number or name. If -1 is specified all tests will be run."
                             ,"[s]*",&test_names,&test_name_count);
    cargo_set_epilog(cargo,
                     "Return code for this usage message equals the number of available tests.");
    if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x2fe5,"int main(int, char **)");
    }
    iVar2 = cargo_parse(cargo,0,1,argc,argv);
    if (iVar2 == 0) {
      if ((test_name_count != 0) || (all != 0)) {
        if (quiet == 0) {
          cargo_suppress_debug = 0;
        }
        uVar7 = test_name_count;
        for (uVar9 = 0; uVar9 < uVar7; uVar9 = uVar9 + 1) {
          pcVar8 = test_names[uVar9];
          iVar2 = strncmp(pcVar8,"TEST_",5);
          if (iVar2 == 0) {
            lVar13 = 0;
            uVar11 = 1;
            while( true ) {
              if (lVar13 == 0x1520) {
                pcVar10 = "Unknown test specified: \"%s\"\n";
                __stream = _stderr;
                goto LAB_0010eb6b;
              }
              iVar2 = strcmp(pcVar8,*(char **)((long)&tests[0].name + lVar13));
              if (iVar2 == 0) break;
              uVar11 = uVar11 + 1;
              lVar13 = lVar13 + 0x20;
            }
          }
          else {
            uVar11 = atoi(pcVar8);
            fprintf(_stderr,"%d\n",(ulong)uVar11);
            if ((uVar11 == 0) || (0xa9 < (int)uVar11)) {
              pcVar8 = test_names[uVar9];
              pcVar10 = "Invalid test number %s\n";
              __stream = _stderr;
              goto LAB_0010eb6b;
            }
            uVar7 = test_name_count;
            if ((int)uVar11 < 0) {
              puts("Run ALL tests!");
              all = 1;
              goto LAB_0010eb83;
            }
          }
          tests_to_run[uVar9] = uVar11;
        }
        if (all != 0) {
LAB_0010eb83:
          lVar13 = 0;
          while (lVar13 != 0xa9) {
            tests_to_run[lVar13] = (int)(lVar13 + 1);
            lVar13 = lVar13 + 1;
          }
          uVar9 = 0xa9;
        }
        local_300 = 0;
        local_2f8 = 0;
        uVar7 = 0;
        while (uVar9 != uVar7) {
          uVar11 = tests_to_run[uVar7];
          lVar13 = (long)(int)uVar11;
          lVar12 = lVar13 * 0x20;
          *(undefined4 *)(&DAT_00131164 + lVar12) = 1;
          local_2e0 = uVar7;
          fprintf(_stderr,"\n%sStart Test %3d:%s - %s\n","\x1b[22;36m",(ulong)uVar11,"\x1b[0m",
                  *(undefined8 *)(&DAT_00131150 + lVar12));
          puVar6 = (undefined *)(**(code **)(lVar12 + 0x131158))();
          (&__dso_handle)[lVar13 * 4] = puVar6;
          fputs("\x1b[0m",_stderr);
          fprintf(_stderr,"%sEnd Test %3d:%s ","\x1b[22;36m",(ulong)uVar11,"\x1b[0m");
          if ((&__dso_handle)[lVar13 * 4] == (undefined *)0x0) {
            fprintf(_stderr,"[%sSUCCESS%s]\n","\x1b[22;32m","\x1b[0m");
            local_2f8 = local_2f8 + 1;
          }
          else {
            fprintf(_stderr,"[%sFAIL%s] %s\n","\x1b[22;31m","\x1b[0m");
            local_300 = local_300 + 1;
          }
          *(uint *)(&data_start + lVar12) = (uint)((&__dso_handle)[lVar13 * 4] == (undefined *)0x0);
          uVar7 = local_2e0 + 1;
        }
        puts("---------------------------------------------------------------");
        puts("Test report:");
        puts("---------------------------------------------------------------");
        lVar13 = 0;
LAB_0010ece4:
        while( true ) {
          lVar12 = lVar13;
          if (lVar12 == 0xa9) {
            if (local_300 == 0) {
              printf("\n[[%sSUCCESS%s]] ","\x1b[22;32m","\x1b[0m");
            }
            else {
              fprintf(_stderr,"\n[[%sFAIL%s]] ","\x1b[22;31m","\x1b[0m");
            }
            lVar13 = local_2f8;
            printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",local_2f8,uVar9,
                   uVar9,0xa9);
            cargo_suppress_debug = 1;
            cargo_destroy(&cargo);
            if (quiet == 0) {
              cargo_suppress_debug = 0;
            }
            return (int)uVar9 - (int)lVar13;
          }
          pcVar1 = tests + lVar12;
          if (tests[lVar12].ran == 0) goto LAB_0010ed24;
          if (tests[lVar12].success != 0) break;
          fprintf(_stderr," [%sFAILED%s]  %3lu: %s - %s\n","\x1b[22;31m","\x1b[0m",lVar12 + 1,
                  pcVar1->name,tests[lVar12].error);
          lVar13 = lVar12 + 1;
        }
        pcVar8 = pcVar1->name;
        __format = " [%sSUCCESS%s] %3lu: %s\n";
        pcVar10 = "=\x1b[22;32m";
        goto LAB_0010ed15;
      }
      _test_print_names();
      cargo_print_usage(cargo,CARGO_USAGE_FULL);
      fwrite("No test specified!\n",0x13,1,_stderr);
    }
    else {
      _test_print_names();
      cargo_print_usage(cargo,CARGO_USAGE_FULL);
      __stream = _stderr;
      pcVar8 = cargo_get_error(cargo);
      pcVar10 = "%s\n";
LAB_0010eb6b:
      fprintf(__stream,pcVar10,pcVar8);
    }
    iVar2 = 0xa9;
  }
  else {
    fwrite("Failed to init command line parsing\n",0x24,1,_stderr);
    iVar2 = -1;
  }
  return iVar2;
LAB_0010ed24:
  lVar13 = lVar12 + 1;
  if (shortlist == 0) {
    pcVar8 = pcVar1->name;
    __format = " [%sNOT RUN%s] %3lu: %s\n";
    pcVar10 = "^\x1b[01;30m";
LAB_0010ed15:
    printf(__format,pcVar10 + 1,"\x1b[0m",lVar12 + 1,pcVar8);
    lVar13 = lVar12 + 1;
  }
  goto LAB_0010ece4;
}

Assistant:

int main(int argc, char **argv)
{
    cargo_t cargo;
    size_t i;
    int was_error = 0;
    int tests_to_run[CARGO_NUM_TESTS];
    size_t num_tests = 0;
    size_t success_count = 0;
    int all = 0;
    int quiet = 0;
    int test_index = 0;
    int shortlist = 0;
    int start = 1;
    int ret = 0;
    char **test_names = NULL;
    size_t test_name_count = 0;
    cargo_test_t *t;

    memset(tests_to_run, 0, sizeof(tests_to_run));

    cargo_suppress_debug = 1;

    if (cargo_init(&cargo, CARGO_AUTOCLEAN | CARGO_NOERR_OUTPUT, argv[0]))
    {
        fprintf(stderr, "Failed to init command line parsing\n");
        return -1;
    }

    cargo_set_description(cargo,
        "You can add additional debug output by compiling with CARGO_DEBUG=<level>");

    ret |= cargo_add_option(cargo, 0, "--shortlist --short -s",
            "Only show the tests that have been run, don't include the entire list.",
            "b", &shortlist);

    ret |= cargo_add_option(cargo, 0, "--all -a",
            "Run all tests.",
            "b", &all);

    ret |= cargo_add_option(cargo, 0, "--quiet -q",
            "Suppress CARGO_DEBUG output.",
            "b", &quiet);

    ret |= cargo_add_option(cargo, 0, "tests",
            "Either a test number or name. "
            "If -1 is specified all tests will be run.",
            "[s]*", &test_names, &test_name_count);

    cargo_set_epilog(cargo,
            "Return code for this usage message equals "
            "the number of available tests.");

    assert(ret == 0);

    if (cargo_parse(cargo, 0, 1, argc, argv))
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "%s\n", cargo_get_error(cargo));
        return CARGO_NUM_TESTS;
    }

    if ((test_name_count == 0) && !all)
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "No test specified!\n");
        return CARGO_NUM_TESTS;
    }

    if (!quiet) cargo_suppress_debug = 0;

    for (i = 0; i < test_name_count; i++)
    {
        // First check if we were given a function name.
        if (!strncmp(test_names[i], "TEST_", 5))
        {
            test_index = _test_find_test_index(test_names[i]);

            if (test_index <= 0)
            {
                fprintf(stderr, "Unknown test specified: \"%s\"\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
        }
        else
        {
            test_index = atoi(test_names[i]);
            fprintf(stderr, "%d\n", test_index);

            if ((test_index == 0) || (test_index > (int)CARGO_NUM_TESTS))
            {
                fprintf(stderr, "Invalid test number %s\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
            else if (test_index < 0)
            {
                printf("Run ALL tests!\n");
                all = 1;
                break;
            }
        }

        tests_to_run[num_tests] = test_index;
        num_tests++;
    }

    // Run all tests.
    if (all)
    {
        num_tests = CARGO_NUM_TESTS;

        for (i = 0; i < num_tests; i++)
        {
            tests_to_run[i] = i + 1;
        }
    }

    // Run the tests.
    for (i = 0; i < num_tests; i++)
    {
        test_index = tests_to_run[i] - 1;
        t = &tests[test_index];
        t->ran = 1;

        fprintf(stderr, "\n%sStart Test %3d:%s - %s\n",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET, t->name);

        //fprintf(stderr, "%s", CARGO_COLOR_DARK_GRAY);
        t->error = t->f();
        fprintf(stderr, "%s", CARGO_COLOR_RESET);

        fprintf(stderr, "%sEnd Test %3d:%s ",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET);

        if (t->error)
        {
            fprintf(stderr, "[%sFAIL%s] %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET, t->error);
            was_error++;
        }
        else
        {
            fprintf(stderr, "[%sSUCCESS%s]\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET);

            success_count++;
        }

        tests[test_index].success = (t->error == NULL);
    }

    printf("---------------------------------------------------------------\n");
    printf("Test report:\n");
    printf("---------------------------------------------------------------\n");

    for (i = 0; i < CARGO_NUM_TESTS; i++)
    {
        if (!tests[i].ran)
        {
            if (!shortlist)
            {
                printf(" [%sNOT RUN%s] %3lu: %s\n",
                    CARGO_COLOR_DARK_GRAY, CARGO_COLOR_RESET, (i + 1), tests[i].name);
            }

            continue;
        }

        if (tests[i].success)
        {
            printf(" [%sSUCCESS%s] %3lu: %s\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET, (i + 1), tests[i].name);
        }
        else
        {
            fprintf(stderr, " [%sFAILED%s]  %3lu: %s - %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET,
                (i + 1), tests[i].name, tests[i].error);
        }
    }

    if (was_error)
    {
        fprintf(stderr, "\n[[%sFAIL%s]] ", CARGO_COLOR_RED, CARGO_COLOR_RESET);
    }
    else
    {
        printf("\n[[%sSUCCESS%s]] ", CARGO_COLOR_GREEN, CARGO_COLOR_RESET);
    }

    printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",
            success_count, num_tests, num_tests, CARGO_NUM_TESTS);

    cargo_suppress_debug = 1;
    cargo_destroy(&cargo);
    if (!quiet) cargo_suppress_debug = 0;

    return (num_tests - success_count);
}